

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_links.hpp
# Opt level: O2

void __thiscall libtorrent::aux::resolve_links::~resolve_links(resolve_links *this)

{
  ::std::
  _Hashtable<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<256L>_>,_std::hash<libtorrent::digest32<256L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&(this->m_file_roots)._M_h);
  ::std::
  _Hashtable<long,_std::pair<const_long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&(this->m_file_sizes)._M_h);
  ::std::
  vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
  ::~vector(&(this->m_links).
             super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
           );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_torrent_file).
              super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT resolve_links
	{
		struct TORRENT_EXTRA_EXPORT link_t
		{
			std::shared_ptr<torrent_info const> ti;
			std::string save_path;
			file_index_t file_idx;
		};

		explicit resolve_links(std::shared_ptr<torrent_info const> ti);

		// check to see if any files are shared with this torrent
		void match(std::shared_ptr<torrent_info const> const& ti
			, std::string const& save_path);

		aux::vector<link_t, file_index_t> const& get_links() const
		{ return m_links; }

	private:

		void match_v1(std::shared_ptr<torrent_info const> const& ti
			, std::string const& save_path);
		void match_v2(std::shared_ptr<torrent_info const> const& ti
			, std::string const& save_path);

		// this is the torrent we're trying to find files for.
		std::shared_ptr<torrent_info const> m_torrent_file;

		// each file in m_torrent_file has an entry in this vector. Any file
		// that also exists somewhere else, is filled in with the corresponding
		// torrent_info object and file index
		aux::vector<link_t, file_index_t> m_links;

		// maps file size to file index, in m_torrent_file
		std::unordered_multimap<std::int64_t, file_index_t> m_file_sizes;

		// maps file root hash to file index, in m_torrent_file
		std::unordered_multimap<sha256_hash, file_index_t> m_file_roots;
	}